

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O1

Position __thiscall
absl::lts_20240722::cord_internal::CordRepBtreeNavigator::Seek
          (CordRepBtreeNavigator *this,size_t offset)

{
  long lVar1;
  CordRepBtree *pCVar2;
  CordRep *pCVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  Position PVar8;
  
  iVar4 = this->height_;
  lVar5 = (long)iVar4;
  if ((lVar5 < 0) || (this->node_[lVar5] == (CordRepBtree *)0x0)) {
    __assert_fail("btree() != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xc0,
                  "CordRepBtreeNavigator::Position absl::cord_internal::CordRepBtreeNavigator::Seek(size_t)"
                 );
  }
  pCVar2 = this->node_[lVar5];
  if (offset < *(ulong *)pCVar2) {
    uVar6 = (ulong)(byte)pCVar2[0xe];
    uVar7 = **(ulong **)(pCVar2 + (uVar6 + 2) * 8);
    if (uVar7 <= offset) {
      do {
        offset = offset - uVar7;
        lVar1 = uVar6 + 3;
        uVar6 = uVar6 + 1;
        uVar7 = **(ulong **)(pCVar2 + lVar1 * 8);
      } while (uVar7 <= offset);
    }
    this->index_[lVar5] = (uint8_t)uVar6;
    if (iVar4 != 0) {
      do {
        if (uVar6 < (byte)pCVar2[0xe]) goto LAB_002beb26;
        if ((byte)pCVar2[0xf] <= uVar6) goto LAB_002beb45;
        pCVar2 = *(CordRepBtree **)(pCVar2 + (uVar6 + 2) * 8);
        if (pCVar2[0xc] != (CordRepBtree)0x3) {
          __assert_fail("IsBtree()",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
        }
        this->node_[lVar5 + -1] = pCVar2;
        if (*(ulong *)pCVar2 <= offset) {
          __assert_fail("offset < length",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,0x329,
                        "CordRepBtree::Position absl::cord_internal::CordRepBtree::IndexOf(size_t) const"
                       );
        }
        uVar6 = (ulong)(byte)pCVar2[0xe];
        uVar7 = **(ulong **)(pCVar2 + (uVar6 + 2) * 8);
        if (uVar7 <= offset) {
          do {
            offset = offset - uVar7;
            lVar1 = uVar6 + 3;
            uVar6 = uVar6 + 1;
            uVar7 = **(ulong **)(pCVar2 + lVar1 * 8);
          } while (uVar7 <= offset);
        }
        this->index_[lVar5 + -1] = (uint8_t)uVar6;
        iVar4 = (int)lVar5;
        lVar5 = lVar5 + -1;
      } while (1 < iVar4);
    }
    if (uVar6 < (byte)pCVar2[0xe]) {
LAB_002beb26:
      __assert_fail("index >= begin()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
    }
    if ((byte)pCVar2[0xf] <= uVar6) {
LAB_002beb45:
      __assert_fail("index < end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
    }
    pCVar3 = *(CordRep **)(pCVar2 + (uVar6 + 2) * 8);
  }
  else {
    pCVar3 = (CordRep *)0x0;
    offset = 0;
  }
  PVar8.offset = offset;
  PVar8.edge = pCVar3;
  return PVar8;
}

Assistant:

inline CordRepBtreeNavigator::Position CordRepBtreeNavigator::Seek(
    size_t offset) {
  assert(btree() != nullptr);
  int height = height_;
  CordRepBtree* edge = node_[height];
  if (ABSL_PREDICT_FALSE(offset >= edge->length)) return {nullptr, 0};
  CordRepBtree::Position index = edge->IndexOf(offset);
  index_[height] = static_cast<uint8_t>(index.index);
  while (--height >= 0) {
    edge = edge->Edge(index.index)->btree();
    node_[height] = edge;
    index = edge->IndexOf(index.n);
    index_[height] = static_cast<uint8_t>(index.index);
  }
  return {edge->Edge(index.index), index.n};
}